

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,String *Prologue)

{
  char *pcVar1;
  _List_node_base *p_Var2;
  ShaderParameterInfo *pSVar3;
  pointer pSVar4;
  HLSL2GLSLConverterImpl *pHVar5;
  iterator *piVar6;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *pvVar7;
  int iVar8;
  _List_node_base *p_Var9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  ostream *poVar11;
  size_t sVar12;
  pointer pSVar13;
  __node_base_ptr p_Var14;
  undefined1 *puVar15;
  ConversionStream *pCVar16;
  _Hash_node_base *p_Var17;
  pointer pSVar18;
  string *psVar19;
  long *plVar20;
  iterator __position;
  string err_4;
  String GLSLVariable;
  Char *ExpectedLiteral;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  String CSGroupSize [3];
  stringstream PrologueSS;
  stringstream GlobalVarsSS;
  String *in_stack_fffffffffffffb88;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_468;
  undefined1 local_460 [39];
  char local_439;
  pointer local_438;
  ConversionStream *local_430;
  String local_428;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  local_408;
  void *local_3e8;
  iterator iStack_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  string local_3c8;
  char *local_3a8;
  long local_3a0;
  char *local_388;
  long local_380;
  long local_378 [3];
  String *local_360;
  String *local_358;
  iterator *local_350;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *local_348;
  stringstream local_340 [16];
  long local_330 [14];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  Args = Prologue;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  local_468._M_node = TypeToken->_M_node->_M_prev;
  local_438 = (pointer)&this->m_Tokens;
  p_Var9 = (this->m_Tokens).
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_430 = this;
  if ((local_468._M_node == p_Var9) || (*(int *)&local_468._M_node[1]._M_next != 0x138)) {
    FormatString<char[31]>(&local_3c8,(char (*) [31])"Missing numthreads declaration");
    in_stack_fffffffffffffb88 = (String *)local_460;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffb88,local_430,&local_468,4);
    Args = &local_3c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcac,Args,(char (*) [2])0x82ea05,in_stack_fffffffffffffb88);
    if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    p_Var9 = *(_List_node_base **)&local_438->storageQualifier;
  }
  for (; local_468._M_node != p_Var9; local_468._M_node = (local_468._M_node)->_M_prev) {
    __position._M_node = local_468._M_node;
    if (*(int *)&local_468._M_node[1]._M_next == 0x137) goto LAB_003867bc;
  }
  FormatString<char[33]>(&local_3c8,(char (*) [33])"Missing numthreads() declaration");
  in_stack_fffffffffffffb88 = (String *)local_460;
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
            (in_stack_fffffffffffffb88,local_430,&local_468,4);
  Args = &local_3c8;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessComputeShaderArguments",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0xcb2,Args,(char (*) [2])0x82ea05,in_stack_fffffffffffffb88);
  if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
    operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
  }
  __position._M_node = local_468._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    __position._M_node = local_468._M_node;
  }
LAB_003867bc:
  local_468._M_node = (__position._M_node)->_M_next;
  if ((((pointer)local_468._M_node == local_438) || (*(int *)&local_468._M_node[1]._M_next != 0x13b)
      ) || (iVar8 = std::__cxx11::string::compare((char *)&local_468._M_node[1]._M_prev), iVar8 != 0
           )) {
    FormatString<char[33]>(&local_3c8,(char (*) [33])"Missing numthreads() declaration");
    in_stack_fffffffffffffb88 = (String *)local_460;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffb88,local_430,&local_468,4);
    Args = &local_3c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcb9,Args,(char (*) [2])0x82ea05,in_stack_fffffffffffffb88);
    if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_468._M_node = (local_468._M_node)->_M_next;
  if (((pointer)local_468._M_node == local_438) || (*(int *)&local_468._M_node[1]._M_next != 0x135))
  {
    FormatString<char[29]>(&local_3c8,(char (*) [29])"Missing \'(\' after numthreads");
    in_stack_fffffffffffffb88 = (String *)local_460;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffb88,local_430,&local_468,4);
    Args = &local_3c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcbf,Args,(char (*) [2])0x82ea05,in_stack_fffffffffffffb88);
    if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_360 = Prologue;
  lVar10 = 0x10;
  do {
    puVar15 = (undefined1 *)((long)&local_3c8._M_dataplus._M_p + lVar10);
    *(undefined1 **)((long)&local_3d8 + lVar10) = puVar15;
    *(undefined8 *)((long)&local_3d8 + lVar10 + 8) = 0;
    *puVar15 = 0;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x70);
  psVar19 = &local_3c8;
  lVar10 = 0;
  pCVar16 = local_430;
  pSVar18 = local_438;
  local_358 = GlobalVariables;
  local_350 = TypeToken;
  local_348 = Params;
  do {
    local_468._M_node = (local_468._M_node)->_M_next;
    if (((pointer)local_468._M_node == pSVar18) ||
       (1 < *(int *)&local_468._M_node[1]._M_next - 0x13bU)) {
      FormatString<char[24],char_const*,char[11]>
                ((string *)local_460,(Diligent *)"Missing group size for ",
                 (char (*) [24])((long)ProcessComputeShaderArguments::DirNames + lVar10),
                 (char **)" direction",(char (*) [11])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_428,pCVar16,&local_468,4);
      in_stack_fffffffffffffb88 = &local_428;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcc9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_460,(char (*) [2])0x82ea05,&local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,
                        CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                                 local_428.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
        operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
      }
    }
    p_Var9 = local_468._M_node[1]._M_prev;
    pcVar1 = *(char **)((long)&local_3c8._M_string_length + lVar10 * 4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           strlen((char *)p_Var9);
    std::__cxx11::string::_M_replace((ulong)psVar19,0,pcVar1,(ulong)p_Var9);
    pCVar16 = local_430;
    pSVar18 = local_438;
    local_468._M_node = (local_468._M_node)->_M_next;
    local_408.
    super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x853c4b;
    if (lVar10 == 0x10) {
      local_408.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x920060;
    }
    if (((pointer)local_468._M_node == local_438) ||
       (iVar8 = std::__cxx11::string::compare((char *)&local_468._M_node[1]._M_prev), iVar8 != 0)) {
      FormatString<char[10],char_const*,char[9],char_const*,char[11]>
                ((string *)local_460,(Diligent *)"Missing \'",(char (*) [10])&local_408,
                 (char **)"\' after ",
                 (char (*) [9])((long)ProcessComputeShaderArguments::DirNames + lVar10),
                 (char **)" direction",(char (*) [11])in_stack_fffffffffffffb88);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_428,pCVar16,&local_468,4);
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
      in_stack_fffffffffffffb88 = &local_428;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcd0,Args,(char (*) [2])0x82ea05,&local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,
                        CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                                 local_428.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
        operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
      }
    }
    piVar6 = local_350;
    lVar10 = lVar10 + 8;
    psVar19 = psVar19 + 1;
  } while (lVar10 != 0x18);
  std::__cxx11::string::_M_assign((string *)&local_350->_M_node[3]._M_prev);
  pvVar7 = local_348;
  pSVar18 = local_438;
  p_Var9 = piVar6->_M_node;
  while (p_Var9 != __position._M_node) {
    p_Var2 = (__position._M_node)->_M_next;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    _M_erase((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)pSVar18,__position);
    __position._M_node = p_Var2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"layout ( local_size_x = ",0x18);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", local_size_y = ",0x11);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a8,local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", local_size_z = ",0x11);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_388,local_380);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ) in;\n",7);
  pSVar18 = (pvVar7->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_438 = (pvVar7->
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar18 != local_438) {
    do {
      if (pSVar18->storageQualifier == Out) {
        LogError<true,char[52]>
                  (false,"ProcessComputeShaderArguments",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xcf6,(char (*) [52])"Output variables are not allowed in compute shaders");
      }
      else if (pSVar18->storageQualifier == In) {
        local_408.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (ShaderParameterInfo **)0x0;
        local_408.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ShaderParameterInfo **)0x0;
        local_408.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderParameterInfo **)0x0;
        local_3d8._M_allocated_capacity = 0;
        local_3e8 = (void *)0x0;
        iStack_3e0._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_460._0_8_ = pSVar18;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_408,(iterator)0x0,(ShaderParameterInfo **)local_460);
        local_460._0_8_ =
             (pSVar18->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_3e0._M_current ==
            (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
             *)local_3d8._M_allocated_capacity) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_3e8,iStack_3e0,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_460);
        }
        else {
          (iStack_3e0._M_current)->_M_current = (ShaderParameterInfo *)local_460._0_8_;
          iStack_3e0._M_current = iStack_3e0._M_current + 1;
        }
        if (((pSVar18->storageQualifier != Ret) && ((pSVar18->GSAttribs).PrimType == Undefined)) &&
           ((pSVar18->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"    ",4);
          pcVar1 = (pSVar18->Type)._M_dataplus._M_p;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)local_330 + (int)*(undefined8 *)(local_330[0] + -0x18));
          }
          else {
            sVar12 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,pcVar1,sVar12);
          }
          local_460[0] = (string)0x20;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_330,(char *)local_460,1);
          pcVar1 = (pSVar18->Name)._M_dataplus._M_p;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
          }
          else {
            sVar12 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar1,sVar12);
          }
          if ((pSVar18->ArraySize)._M_string_length != 0) {
            local_460[0] = (string)0x5b;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_330,(char *)local_460,1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pSVar18->ArraySize)._M_dataplus._M_p,
                                 (pSVar18->ArraySize)._M_string_length);
            local_460[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_460,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,";\n",2);
        }
        while (local_408.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_408.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar3 = local_408.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          pSVar4 = (pSVar3->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar13 = (pSVar3->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar4 == pSVar13) {
            if (iStack_3e0._M_current[-1]._M_current != pSVar4) {
              FormatString<char[26],char[49]>
                        ((string *)local_460,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])pSVar4);
              DebugAssertionFailed
                        ((Char *)local_460._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
                operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
              }
            }
            if ((pSVar3->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar3->Name,
                         (char (*) [2])0x84c5e7);
            }
            local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
            local_428._M_string_length = 0;
            local_428.field_2._M_local_buf[0] = '\0';
            pHVar5 = local_430->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_460,(pSVar3->Semantic)._M_dataplus._M_p,false);
            pCVar16 = (ConversionStream *)
                      ((local_460._8_8_ & 0x7fffffffffffffff) %
                      (pHVar5->m_HLSLSemanticToGLSLVar)._M_elems[5]._M_elems[0]._M_h._M_bucket_count
                      );
            p_Var14 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  *)((pHVar5->m_HLSLSemanticToGLSLVar)._M_elems + 5),
                                 (size_type)pCVar16,(key_type *)local_460,
                                 local_460._8_8_ & 0x7fffffffffffffff);
            if (p_Var14 == (__node_base_ptr)0x0) {
              p_Var17 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var17 = p_Var14->_M_nxt;
            }
            if (((pointer)local_460._0_8_ != (pointer)0x0) && ((long)local_460._8_8_ < 0)) {
              operator_delete__((void *)local_460._0_8_);
            }
            if (p_Var17 != (_Hash_node_base *)0x0) {
              pCVar16 = (ConversionStream *)(p_Var17 + 3);
              std::__cxx11::string::_M_assign((string *)&local_428);
            }
            BuildParameterName_abi_cxx11_((string *)local_460,pCVar16,&local_408,'.',"","","");
            if (local_428._M_string_length == 0) {
              LogError<true,char[28],std::__cxx11::string,char[142]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xcee,(char (*) [28])"Unexpected input semantic \"",&pSVar3->Semantic,
                         (char (*) [142])
                         "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", \"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\"."
                        );
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"    ",4);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_330,local_428._M_dataplus._M_p,
                                 local_428._M_string_length);
            local_439 = '(';
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_439,1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pSVar3->Type)._M_dataplus._M_p,
                                 (pSVar3->Type)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_460._0_8_,local_460._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,");\n",3);
            if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
              operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
            }
            local_408.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_408.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            iStack_3e0._M_current = iStack_3e0._M_current + -1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,
                              CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                                       local_428.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            if ((pSVar3->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar3->Name,
                         (char (*) [2])0x84c5e7);
              pSVar13 = (pSVar3->members).
                        super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pSVar4 = iStack_3e0._M_current[-1]._M_current;
            if (pSVar4 == pSVar13) {
              local_408.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_408.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              iStack_3e0._M_current = iStack_3e0._M_current + -1;
            }
            else {
              iStack_3e0._M_current[-1]._M_current = pSVar4 + 1;
              if (local_408.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_408.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_460._0_8_ = pSVar4;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_408,
                           (iterator)
                           local_408.
                           super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (ShaderParameterInfo **)local_460);
              }
              else {
                *local_408.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
                local_408.
                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_408.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_460._0_8_ =
                   (pSVar4->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iStack_3e0._M_current ==
                  (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)local_3d8._M_allocated_capacity) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_3e8,iStack_3e0,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_460);
              }
              else {
                (iStack_3e0._M_current)->_M_current = (ShaderParameterInfo *)local_460._0_8_;
                iStack_3e0._M_current = iStack_3e0._M_current + 1;
              }
            }
          }
        }
        if (local_3e8 != (void *)0x0) {
          operator_delete(local_3e8,local_3d8._M_allocated_capacity - (long)local_3e8);
        }
        if (local_408.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (ShaderParameterInfo **)0x0) {
          operator_delete(local_408.
                          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_408.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_408.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      pSVar18 = pSVar18 + 1;
    } while (pSVar18 != local_438);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_358,(string *)local_460);
  if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
    operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_360,(string *)local_460);
  if ((pointer)local_460._0_8_ != (pointer)(local_460 + 0x10)) {
    operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
  }
  lVar10 = -0x60;
  plVar20 = local_378;
  do {
    if (plVar20 != (long *)plVar20[-2]) {
      operator_delete((long *)plVar20[-2],*plVar20 + 1);
    }
    plVar20 = plVar20 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments(TokenListType::iterator&          TypeToken,
                                                                             std::vector<ShaderParameterInfo>& Params,
                                                                             String&                           GlobalVariables,
                                                                             String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS;

    auto Token = TypeToken;
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    --Token;
    //[numthreads(16,16,1)]
    //                    ^
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin() && Token->Type == TokenType::ClosingSquareBracket, "Missing numthreads declaration");

    while (Token != m_Tokens.begin() && Token->Type != TokenType::OpenSquareBracket)
        --Token;
    //[numthreads(16,16,1)]
    //^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin(), "Missing numthreads() declaration");
    auto OpenStapleToken = Token;

    ++Token;
    //[numthreads(16,16,1)]
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::Identifier && Token->Literal == "numthreads",
                        "Missing numthreads() declaration");

    ++Token;
    //[numthreads(16,16,1)]
    //           ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::OpenParen,
                        "Missing \'(\' after numthreads");

    String             CSGroupSize[3] = {};
    static const Char* DirNames[]     = {"X", "Y", "Z"};
    for (int i = 0; i < 3; ++i)
    {
        ++Token;
        //[numthreads(16,16,1)]
        //            ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && (Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier),
                            "Missing group size for ", DirNames[i], " direction");
        CSGroupSize[i] = Token->Literal.c_str();
        ++Token;
        //[numthreads(16,16,1)]
        //              ^    ^
        const Char* ExpectedLiteral = (i < 2) ? "," : ")";
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Literal == ExpectedLiteral,
                            "Missing \'", ExpectedLiteral, "\' after ", DirNames[i], " direction");
    }

    //OpenStapleToken
    //V
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    //TypeToken
    TypeToken->Delimiter = OpenStapleToken->Delimiter;
    m_Tokens.erase(OpenStapleToken, TypeToken);
    //
    // void TestCS(uint3 DTid : SV_DispatchThreadID)

    GlobalVarsSS << "layout ( local_size_x = " << CSGroupSize[0]
                 << ", local_size_y = " << CSGroupSize[1] << ", local_size_z = " << CSGroupSize[2] << " ) in;\n";

    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, CSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (Getter.empty())
                    {
                        LOG_ERROR_AND_THROW("Unexpected input semantic \"", Param.Semantic,
                                            "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", "
                                            "\"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\".");
                    }
                    PrologueSS << "    " << Getter << '(' << Param.Type << "," << FullParamName << ");\n";
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out)
        {
            LOG_ERROR_AND_THROW("Output variables are not allowed in compute shaders");
        }
    }

    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}